

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O0

void llama_grammar_accept_str(llama_grammar *grammar,string *piece)

{
  bool bVar1;
  const_iterator __lhs;
  runtime_error *this;
  string *in_RSI;
  llama_partial_utf8 in_RDI;
  uint32_t in_stack_0000001c;
  llama_grammar *in_stack_00000020;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  end;
  const_iterator it;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *code_points;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_llama_partial_utf8> decoded;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff58;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffff60;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  string local_88 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [24];
  undefined8 local_18;
  
  local_38 = *(undefined8 *)((long)in_RDI + 0x38);
  decode_utf8(in_RSI,in_RDI);
  local_40 = local_30;
  local_48._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (in_stack_ffffffffffffff58);
  __lhs = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff58);
  __gnu_cxx::
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::operator-(in_stack_ffffffffffffff68,(difference_type)in_stack_ffffffffffffff60);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff60,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator*(&local_48);
    llama_grammar_accept(in_stack_00000020,in_stack_0000001c);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_48);
  }
  *(undefined8 *)((long)in_RDI + 0x38) = local_18;
  bVar1 = std::
          vector<std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>,_std::allocator<std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>_>_>
          ::empty((vector<std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>,_std::allocator<std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  if (!bVar1) {
    std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_llama_partial_utf8>::~pair
              ((pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_llama_partial_utf8> *
               )0x3f56ba);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((char *)__lhs._M_current,in_stack_ffffffffffffffa0);
  std::runtime_error::runtime_error(this,local_88);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void llama_grammar_accept_str(struct llama_grammar & grammar, const std::string & piece) {
    // Note terminating 0 in decoded string
    const auto   decoded     = decode_utf8(piece, grammar.partial_utf8);
    const auto & code_points = decoded.first;

    for (auto it = code_points.begin(), end = code_points.end() - 1; it != end; ++it) {
        llama_grammar_accept(&grammar, *it);
    }

    grammar.partial_utf8 = decoded.second;
    if (grammar.stacks.empty()) {
        throw std::runtime_error("Unexpected empty grammar stack after accepting piece: " + piece);
    }
}